

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

void __thiscall dumper::dumpkeys(dumper *this,uint32_t id,string *path)

{
  uint uVar1;
  key *pkVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while (id != 0) {
    pkVar2 = getkey(this,id);
    (*this->_vptr_dumper[3])(this,pkVar2,path);
    dumpvalues(this,pkVar2->_firstvalue & 0xfffffff);
    uVar1 = pkVar2->_firstchild;
    std::operator+(&local_70,path,"\\");
    std::__cxx11::string::string((string *)&local_90,(string *)&pkVar2->_name);
    std::operator+(&local_50,&local_70,&local_90);
    dumpkeys(this,uVar1 & 0xfffffff,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    id = pkVar2->_nextsibling & 0xfffffff;
  }
  return;
}

Assistant:

void dumpkeys(uint32_t id, const std::string& path)
    {
        while (id)
        {
            ent::key *k= getkey(id);
            dumpkey(k, path);
            dumpvalues(k->firstvalue());
            dumpkeys(k->firstchild(), path+"\\"+k->name());
            id= k->nextsibling();
        }
    }